

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::PropertiesView::readFrom(PropertiesView *this,uint8 *_buffer,uint32 bufLength)

{
  ushort uVar1;
  uint32 uVar2;
  ushort uVar3;
  
  (this->length).size = 0;
  uVar3 = 0;
  while( true ) {
    if (bufLength <= uVar3) {
      return 0xfffffffe;
    }
    (this->length).field_0.value[uVar3] = _buffer[uVar3];
    uVar1 = (this->length).size;
    uVar3 = uVar1 + 1;
    (this->length).size = uVar3;
    if (-1 < (char)(this->length).field_0.value[uVar1]) break;
    if (uVar3 == 4) {
      return 0xffffffff;
    }
  }
  uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if (bufLength - (this->length).size < uVar2) {
    return 0xfffffffe;
  }
  this->buffer = _buffer + (uint)uVar3;
  uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  return uVar2 + uVar3;
}

Assistant:

uint32 readFrom(const uint8 * _buffer, uint32 bufLength)
                {
                    uint32 o = length.readFrom(_buffer, bufLength);
                    if (isError(o)) return o;
                    if ((uint32)length > bufLength - length.getSize()) return NotEnoughData;
                    buffer = _buffer + o;
                    return o + (uint32)length;
                }